

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticPrism>::HDivDirections
          (TPZGeoElRefLess<pzgeom::TPZQuadraticPrism> *this,TPZVec<double> *pt,
          TPZFMatrix<double> *directions)

{
  undefined8 in_RSI;
  long *in_RDI;
  TPZFNMatrix<9,_double> gradx;
  TPZFNMatrix<9,_double> axes;
  TPZFNMatrix<9,_double> jacinv;
  TPZFNMatrix<9,_double> jac;
  TPZFMatrix<double> *in_stack_00000848;
  TPZFMatrix<double> *in_stack_00000850;
  int64_t in_stack_fffffffffffffc50;
  int64_t in_stack_fffffffffffffc58;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffffc60;
  double *in_stack_fffffffffffffc68;
  int64_t in_stack_fffffffffffffc70;
  int64_t in_stack_fffffffffffffc78;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffffc80;
  
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
             in_stack_fffffffffffffc68);
  (**(code **)(*in_RDI + 0x230))(in_RDI,in_RSI,&stack0xfffffffffffffc58);
  pztopology::TPZPrism::ComputeHDivDirections<double>(in_stack_00000850,in_stack_00000848);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x177f7c4);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x177f7d1);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x177f7de);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x177f7eb);
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::HDivDirections(TPZVec<REAL> &pt, TPZFMatrix<REAL> &directions)
{
    TPZFNMatrix<9,REAL> jac(TGeo::Dimension,TGeo::Dimension), jacinv(TGeo::Dimension,TGeo::Dimension), axes(TGeo::Dimension,3), gradx(3,TGeo::Dimension,0.);
  
    this->GradX(pt, gradx);

    TGeo::ComputeHDivDirections(gradx, directions);
    
}